

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
::fulfill(AdapterPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_kj::Canceler::AdapterImpl<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>_>
          *this,OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *value)

{
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> EStack_1d8;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::ExceptionOr
              (&EStack_1d8,value);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::operator=
              (&this->result,&EStack_1d8);
    ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_>::
    ~ExceptionOr(&EStack_1d8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }